

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_loop.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseFor(Parser *this,bool isdo)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  uint in_EDX;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Parser *this_00;
  pointer __old_p_1;
  BodyExpr *pBVar4;
  BodyExpr *pBVar5;
  pointer __old_p;
  _Head_base<0UL,_pfederc::BodyExpr_*,_false> local_98;
  _Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false> local_90;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_88;
  undefined1 local_7c [28];
  undefined1 local_60 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined1 local_40 [16];
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isdo);
  if (in_EDX == 0) {
    sanityExpect(this_00,TOK_KW_FOR);
    local_88._M_head_impl = (Expr *)0x0;
    local_98._M_head_impl = (BodyExpr *)0x0;
    parseExpression((Parser *)(local_7c + 4),isdo);
    pBVar5 = (BodyExpr *)local_7c._4_8_;
    local_90._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)local_7c._4_8_;
    bVar3 = expect(this_00,TOK_STMT);
    pBVar4 = (BodyExpr *)0x0;
    if (bVar3) {
      skipEol(this_00);
      parseExpression((Parser *)(local_7c + 4),isdo);
      uVar1 = local_7c._4_8_;
      local_98._M_head_impl = (BodyExpr *)local_7c._4_8_;
      bVar3 = expect(this_00,TOK_STMT);
      pBVar4 = (BodyExpr *)uVar1;
      if (bVar3) {
        skipEol(this_00);
        local_88._M_head_impl = &pBVar5->super_Expr;
        local_90._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)uVar1;
        parseExpression((Parser *)(local_7c + 4),isdo);
        local_98._M_head_impl = (BodyExpr *)local_7c._4_8_;
        pBVar4 = (BodyExpr *)local_7c._4_8_;
        pBVar5 = (BodyExpr *)uVar1;
      }
    }
  }
  else {
    sanityExpect(this_00,TOK_KW_DO);
    local_88._M_head_impl = (Expr *)0x0;
    local_90._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)0x0;
    local_98._M_head_impl = (BodyExpr *)0x0;
    bVar3 = Token::operator!=(this_00->lexer->currentToken,TOK_EOL);
    if ((bVar3) && (bVar3 = Token::operator!=(this_00->lexer->currentToken,TOK_EOF), bVar3)) {
      parseExpression((Parser *)(local_7c + 4),isdo);
      local_88._M_head_impl = (Expr *)local_7c._4_8_;
    }
    pBVar4 = (BodyExpr *)0x0;
    pBVar5 = (BodyExpr *)0x0;
  }
  bVar3 = expect(this_00,TOK_EOL);
  if (!bVar3) {
    local_60._0_2_ = 2;
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0xf;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_7c + 4),(SyntaxErrorCode *)local_60,(Position *)&bodyExpr);
    generateError((Parser *)(local_40 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_40 + 8));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_7c + 4));
    skipToEol(this_00);
  }
  parseFunctionBody((Parser *)&bodyExpr);
  bVar3 = expect(this_00,TOK_STMT);
  if (!bVar3) {
    local_7c._0_2_ = 2;
    local_60._0_4_ = 0xf;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_7c + 4),(SyntaxErrorCode *)local_7c,(Position *)local_60);
    generateError((Parser *)local_40,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_40)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_7c + 4));
  }
  if ((char)in_EDX != '\0') {
    bVar3 = expect(this_00,TOK_KW_FOR);
    if (bVar3) {
      parseExpression((Parser *)(local_7c + 4),isdo);
      uVar1 = local_7c._4_8_;
      local_7c._4_8_ = (BodyExpr *)0x0;
      local_90._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)uVar1;
      if ((pBVar5 != (BodyExpr *)0x0) &&
         ((*(pBVar5->super_Expr)._vptr_Expr[1])(pBVar5),
         (BodyExpr *)local_7c._4_8_ != (BodyExpr *)0x0)) {
        (*((Expr *)local_7c._4_8_)->_vptr_Expr[1])();
      }
      bVar3 = expect(this_00,TOK_STMT);
      pBVar5 = (BodyExpr *)uVar1;
      if (bVar3) {
        skipEol(this_00);
        parseExpression((Parser *)(local_7c + 4),isdo);
        local_98._M_head_impl = (BodyExpr *)local_7c._4_8_;
        local_7c._4_8_ = (BodyExpr *)0x0;
        if ((pBVar4 != (BodyExpr *)0x0) &&
           ((*(pBVar4->super_Expr)._vptr_Expr[1])(pBVar4),
           (BodyExpr *)local_7c._4_8_ != (BodyExpr *)0x0)) {
          (*((Expr *)local_7c._4_8_)->_vptr_Expr[1])();
        }
      }
    }
    else {
      local_7c._0_2_ = 2;
      local_60._0_4_ = 0x20;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_7c + 4),(SyntaxErrorCode *)local_7c,(Position *)local_60);
      generateError((Parser *)&stack0xffffffffffffffb8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this_00);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffb8);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_7c + 4));
      skipToEol(this_00);
    }
  }
  if ((pBVar5 == (BodyExpr *)0x0) ||
     (CONCAT44(bodyExpr._M_t.
               super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
               _M_t.
               super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
               super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._4_4_,
               bodyExpr._M_t.
               super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
               _M_t.
               super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
               super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_) == 0)) {
    this->lexer = (Lexer *)0x0;
  }
  else {
    local_7c._4_8_ = (pBVar5->super_Expr).pos.line;
    local_7c._12_8_ = (pBVar5->super_Expr).pos.startIndex;
    local_7c._20_8_ = (pBVar5->super_Expr).pos.endIndex;
    local_7c._0_4_ = (in_EDX & 0xff) + STX_ERR_EXPECTED_EOL;
    std::
    make_unique<pfederc::LoopExpr,pfederc::Lexer&,pfederc::ExprType,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
              ((Lexer *)local_60,(ExprType *)this_00->lexer,(Position *)local_7c,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_7c + 4),
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_88,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_90,
               (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)&local_98);
    auVar2 = local_60;
    local_60 = (undefined1  [8])0x0;
    this->lexer = (Lexer *)auVar2;
    std::unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> *)local_60);
  }
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&bodyExpr);
  if (local_98._M_head_impl != (BodyExpr *)0x0) {
    (*((local_98._M_head_impl)->super_Expr)._vptr_Expr[1])();
  }
  if ((BodyExpr *)local_90._M_head_impl != (BodyExpr *)0x0) {
    (**(code **)(*(long *)local_90._M_head_impl + 8))();
  }
  if ((BodyExpr *)local_88._M_head_impl != (BodyExpr *)0x0) {
    (*((Expr *)&(local_88._M_head_impl)->_vptr_Expr)->_vptr_Expr[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseFor(bool isdo) noexcept {
  if (isdo)
    sanityExpect(TokenType::TOK_KW_DO);
  else
    sanityExpect(TokenType::TOK_KW_FOR);

  std::unique_ptr<Expr> initExpr, condExpr, itExpr;

  if (isdo) {
    if (*lexer.getCurrentToken() != TokenType::TOK_EOL
        && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
      initExpr = parseExpression();
    }
  } else {
    condExpr = parseExpression();
    if (expect(TokenType::TOK_STMT)) {
      skipEol();
      itExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        // switch expressions
        initExpr = std::move(condExpr);
        condExpr = std::move(itExpr);
        itExpr = parseExpression();
      }
    }
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
  }

  if (isdo) {
    if (!expect(TokenType::TOK_KW_FOR)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_FOR,
            lexer.getCurrentToken()->getPosition()));
      skipToEol();
    } else {
      condExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        itExpr = parseExpression();
      }
    }
  }

  if (!condExpr || !bodyExpr)
    return nullptr;

  Position pos = condExpr->getPosition();

  return std::make_unique<LoopExpr>(lexer,
      isdo ? ExprType::EXPR_LOOP_DO : ExprType::EXPR_LOOP_FOR, pos,
      std::move(initExpr), std::move(condExpr), std::move(itExpr),
      std::move(bodyExpr));
}